

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_write_set_filter_option.c
# Opt level: O0

void test(int pristine)

{
  int iVar1;
  int iVar2;
  archive *a_00;
  void *extra;
  char *file;
  char *file_00;
  char *v2;
  int in_EDI;
  int known_option_rv;
  int halfempty_options_rv;
  archive *a;
  char *in_stack_ffffffffffffffa8;
  char *pcVar3;
  char *pcVar4;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar5;
  uint in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  wchar_t line;
  archive *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  wchar_t wVar6;
  archive *in_stack_ffffffffffffffd8;
  void *in_stack_ffffffffffffffe0;
  wchar_t in_stack_fffffffffffffff8;
  
  wVar6 = (wchar_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  a_00 = archive_write_new();
  iVar1 = 0;
  if (in_EDI != 0) {
    iVar1 = -0x19;
  }
  iVar2 = 0;
  if (in_EDI == 0) {
    archive_write_add_filter_gzip(in_stack_ffffffffffffffc8);
    archive_write_set_format_iso9660(in_stack_ffffffffffffffd8);
  }
  else {
    iVar2 = -0x19;
  }
  archive_write_set_options
            ((archive *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8);
  pcVar3 = (char *)0x0;
  assertion_equal_int((char *)in_stack_ffffffffffffffc8,
                      (wchar_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                      (longlong)in_stack_ffffffffffffffb8,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),0,
                      (char *)0x13f193,in_stack_ffffffffffffffe0);
  archive_write_set_options
            ((archive *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),pcVar3);
  pcVar3 = (char *)0x0;
  assertion_equal_int((char *)in_stack_ffffffffffffffc8,
                      (wchar_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                      (longlong)in_stack_ffffffffffffffb8,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),0,
                      (char *)0x13f1d2,in_stack_ffffffffffffffe0);
  archive_write_set_options
            ((archive *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),pcVar3);
  assertion_equal_int((char *)in_stack_ffffffffffffffc8,
                      (wchar_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                      (longlong)in_stack_ffffffffffffffb8,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),0,
                      (char *)0x13f216,in_stack_ffffffffffffffe0);
  archive_error_string(a_00);
  pcVar3 = (char *)0x0;
  uVar5 = 0;
  assertion_equal_string
            ((char *)in_stack_ffffffffffffffd8,wVar6,(char *)in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (char *)((ulong)in_stack_ffffffffffffffb4 << 0x20),a_00,in_stack_fffffffffffffff8);
  archive_write_set_options((archive *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),pcVar3);
  assertion_equal_int((char *)in_stack_ffffffffffffffc8,
                      (wchar_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                      (longlong)in_stack_ffffffffffffffb8,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),0,(char *)0x13f2a1,
                      in_stack_ffffffffffffffe0);
  archive_error_string(a_00);
  pcVar3 = (char *)0x0;
  uVar5 = 0;
  assertion_equal_string
            ((char *)in_stack_ffffffffffffffd8,wVar6,(char *)in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (char *)((ulong)in_stack_ffffffffffffffb4 << 0x20),a_00,in_stack_fffffffffffffff8);
  archive_write_set_options((archive *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),pcVar3);
  assertion_equal_int((char *)in_stack_ffffffffffffffc8,
                      (wchar_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                      (longlong)in_stack_ffffffffffffffb8,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),0,(char *)0x13f32c,
                      in_stack_ffffffffffffffe0);
  archive_error_string(a_00);
  pcVar3 = (char *)0x0;
  uVar5 = 0;
  assertion_equal_string
            ((char *)in_stack_ffffffffffffffd8,wVar6,(char *)in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (char *)((ulong)in_stack_ffffffffffffffb4 << 0x20),a_00,in_stack_fffffffffffffff8);
  archive_write_set_options((archive *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),pcVar3);
  assertion_equal_int((char *)in_stack_ffffffffffffffc8,
                      (wchar_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                      (longlong)in_stack_ffffffffffffffb8,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),0,(char *)0x13f3b7,
                      in_stack_ffffffffffffffe0);
  archive_error_string(a_00);
  pcVar3 = (char *)0x0;
  uVar5 = 0;
  assertion_equal_string
            ((char *)in_stack_ffffffffffffffd8,wVar6,(char *)in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (char *)((ulong)in_stack_ffffffffffffffb4 << 0x20),a_00,in_stack_fffffffffffffff8);
  extra = (void *)(long)iVar2;
  archive_write_set_options((archive *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),pcVar3);
  pcVar3 = (char *)0x0;
  assertion_equal_int((char *)in_stack_ffffffffffffffc8,
                      (wchar_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                      (longlong)in_stack_ffffffffffffffb8,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),0,(char *)0x13f44a,extra);
  if (in_EDI != 0) {
    archive_error_string(a_00);
    pcVar3 = (char *)0x0;
    uVar5 = 0;
    assertion_equal_string
              ((char *)in_stack_ffffffffffffffd8,wVar6,(char *)in_stack_ffffffffffffffc8,
               in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               (char *)((ulong)in_stack_ffffffffffffffb4 << 0x20),a_00,in_stack_fffffffffffffff8);
  }
  file = (char *)(long)iVar2;
  archive_write_set_options((archive *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),pcVar3);
  pcVar3 = (char *)0x0;
  assertion_equal_int((char *)in_stack_ffffffffffffffc8,
                      (wchar_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                      (longlong)in_stack_ffffffffffffffb8,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),0,(char *)0x13f4e4,extra);
  if (in_EDI != 0) {
    archive_error_string(a_00);
    pcVar3 = (char *)0x0;
    uVar5 = 0;
    assertion_equal_string
              (file,wVar6,(char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffb8,(char *)((ulong)in_stack_ffffffffffffffb4 << 0x20),a_00,
               in_stack_fffffffffffffff8);
  }
  wVar6 = iVar2 >> 0x1f;
  archive_write_set_options((archive *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),pcVar3);
  pcVar3 = (char *)0x0;
  assertion_equal_int((char *)in_stack_ffffffffffffffc8,
                      (wchar_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                      (longlong)in_stack_ffffffffffffffb8,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),0,(char *)0x13f57e,extra);
  if (in_EDI != 0) {
    archive_error_string(a_00);
    pcVar3 = (char *)0x0;
    uVar5 = 0;
    assertion_equal_string
              (file,wVar6,(char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffb8,(char *)((ulong)in_stack_ffffffffffffffb4 << 0x20),a_00,
               in_stack_fffffffffffffff8);
  }
  file_00 = (char *)(long)iVar2;
  archive_write_set_options((archive *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),pcVar3);
  pcVar3 = (char *)0x0;
  assertion_equal_int(file_00,(wchar_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                      (longlong)in_stack_ffffffffffffffb8,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),0,(char *)0x13f618,extra);
  if (in_EDI != 0) {
    archive_error_string(a_00);
    pcVar3 = (char *)0x0;
    uVar5 = 0;
    assertion_equal_string
              (file,wVar6,file_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               (char *)((ulong)in_stack_ffffffffffffffb4 << 0x20),a_00,in_stack_fffffffffffffff8);
  }
  line = (wchar_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  archive_write_set_options((archive *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),pcVar3);
  pcVar3 = (char *)0x0;
  assertion_equal_int(file_00,line,(longlong)in_stack_ffffffffffffffb8,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),0,(char *)0x13f6a5,extra);
  archive_write_set_options((archive *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),pcVar3);
  pcVar4 = (char *)0x0;
  assertion_equal_int(file_00,line,(longlong)in_stack_ffffffffffffffb8,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),0,(char *)0x13f6e4,extra);
  pcVar3 = (char *)(long)iVar1;
  archive_write_set_options((archive *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),pcVar4);
  pcVar4 = (char *)0x0;
  assertion_equal_int(file_00,(wchar_t)((ulong)pcVar3 >> 0x20),(longlong)in_stack_ffffffffffffffb8,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),0,(char *)0x13f730,extra);
  if (in_EDI != 0) {
    archive_error_string(a_00);
    pcVar4 = (char *)0x0;
    uVar5 = 0;
    assertion_equal_string
              (file,wVar6,file_00,pcVar3,in_stack_ffffffffffffffb8,
               (char *)((ulong)in_stack_ffffffffffffffb4 << 0x20),a_00,in_stack_fffffffffffffff8);
  }
  v2 = (char *)(long)iVar1;
  archive_write_set_options((archive *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),pcVar4);
  pcVar4 = (char *)0x0;
  assertion_equal_int(file_00,(wchar_t)((ulong)pcVar3 >> 0x20),(longlong)v2,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),0,(char *)0x13f7ca,extra);
  if (in_EDI != 0) {
    archive_error_string(a_00);
    pcVar4 = (char *)0x0;
    uVar5 = 0;
    assertion_equal_string
              (file,wVar6,file_00,pcVar3,v2,(char *)((ulong)in_stack_ffffffffffffffb4 << 0x20),a_00,
               in_stack_fffffffffffffff8);
  }
  archive_write_set_options((archive *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),pcVar4);
  assertion_equal_int(file_00,(wchar_t)((ulong)pcVar3 >> 0x20),(longlong)v2,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),0,(char *)0x13f85c,extra);
  if (in_EDI == 0) {
    archive_error_string(a_00);
    pcVar4 = (char *)0x0;
    uVar5 = 0;
    assertion_equal_string
              (file,wVar6,file_00,pcVar3,v2,(char *)((ulong)in_stack_ffffffffffffffb4 << 0x20),a_00,
               in_stack_fffffffffffffff8);
  }
  else {
    archive_error_string(a_00);
    pcVar4 = (char *)0x0;
    uVar5 = 0;
    assertion_equal_string
              (file,wVar6,file_00,pcVar3,v2,(char *)((ulong)in_stack_ffffffffffffffb4 << 0x20),a_00,
               in_stack_fffffffffffffff8);
  }
  archive_write_set_options((archive *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),pcVar4);
  assertion_equal_int(file_00,(wchar_t)((ulong)pcVar3 >> 0x20),(longlong)v2,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),0,(char *)0x13f937,extra);
  if (in_EDI == 0) {
    archive_error_string(a_00);
    assertion_equal_string
              (file,wVar6,file_00,pcVar3,v2,(char *)((ulong)in_stack_ffffffffffffffb4 << 0x20),a_00,
               in_stack_fffffffffffffff8);
  }
  else {
    archive_error_string(a_00);
    assertion_equal_string
              (file,wVar6,file_00,pcVar3,v2,(char *)((ulong)in_stack_ffffffffffffffb4 << 0x20),a_00,
               in_stack_fffffffffffffff8);
  }
  archive_write_free((archive *)0x13f9d8);
  return;
}

Assistant:

static void
test(int pristine)
{
	struct archive* a = archive_write_new();

	if (!pristine)
		archive_write_add_filter_gzip(a);

	should(a, ARCHIVE_OK, NULL, NULL, NULL);
	should(a, ARCHIVE_OK, "", "", "");

	should(a, ARCHIVE_FAILED, NULL, "fubar", NULL);
	should(a, ARCHIVE_FAILED, NULL, "fubar", "snafu");
	should(a, ARCHIVE_FAILED, "fubar", "snafu", NULL);
	should(a, ARCHIVE_FAILED, "fubar", "snafu", "betcha");

	archive_write_free(a);
}